

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O0

void duckdb::TemplatedWritePlain<int,int,duckdb::ParquetCastOperator,true>
               (Vector *col,ColumnWriterStatistics *stats,idx_t chunk_start,idx_t chunk_end,
               ValidityMask *mask,WriteStream *ser)

{
  int iVar1;
  int *piVar2;
  const_data_ptr_t pdVar3;
  ulong in_RCX;
  ulong in_RDX;
  undefined8 *in_R9;
  int target_value;
  idx_t r;
  idx_t local_write_count;
  int local_write [2048];
  int *ptr;
  undefined8 in_stack_ffffffffffffdfa8;
  undefined4 in_stack_ffffffffffffdfb0;
  ulong local_2048;
  
  piVar2 = FlatVector::GetData<int>((Vector *)0x5a3c24);
  for (local_2048 = in_RDX; local_2048 < in_RCX; local_2048 = local_2048 + 1) {
    iVar1 = ParquetCastOperator::Operation<int,int>(piVar2[local_2048]);
    ParquetCastOperator::HandleStats<int,int>
              ((ColumnWriterStatistics *)CONCAT44(iVar1,in_stack_ffffffffffffdfb0),
               (int)((ulong)in_stack_ffffffffffffdfa8 >> 0x20));
  }
  pdVar3 = const_data_ptr_cast<int>(piVar2 + in_RDX);
  (**(code **)*in_R9)(in_R9,pdVar3,(in_RCX - in_RDX) * 4);
  return;
}

Assistant:

static void TemplatedWritePlain(Vector &col, ColumnWriterStatistics *stats, const idx_t chunk_start,
                                const idx_t chunk_end, const ValidityMask &mask, WriteStream &ser) {
	static constexpr bool COPY_DIRECTLY_FROM_VECTOR =
	    ALL_VALID && std::is_same<SRC, TGT>::value && std::is_arithmetic<TGT>::value;

	const auto *const ptr = FlatVector::GetData<SRC>(col);

	TGT local_write[STANDARD_VECTOR_SIZE];
	idx_t local_write_count = 0;

	for (idx_t r = chunk_start; r < chunk_end; r++) {
		if (!ALL_VALID && !mask.RowIsValid(r)) {
			continue;
		}

		TGT target_value = OP::template Operation<SRC, TGT>(ptr[r]);
		OP::template HandleStats<SRC, TGT>(stats, target_value);

		if (COPY_DIRECTLY_FROM_VECTOR) {
			continue;
		}

		if (std::is_arithmetic<TGT>::value) {
			local_write[local_write_count++] = target_value;
			if (local_write_count == STANDARD_VECTOR_SIZE) {
				ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
				local_write_count = 0;
			}
		} else {
			OP::template WriteToStream<SRC, TGT>(target_value, ser);
		}
	}

	if (COPY_DIRECTLY_FROM_VECTOR) {
		ser.WriteData(const_data_ptr_cast(&ptr[chunk_start]), (chunk_end - chunk_start) * sizeof(TGT));
		return;
	}

	if (std::is_arithmetic<TGT>::value) {
		ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
	}
	// Else we already wrote to stream
}